

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchQbf.cpp
# Opt level: O1

void Bmatch_CreatePOMUXes(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Abc_Ntk_t *pNtk_Qbf)

{
  char cVar1;
  Abc_Aig_t *pMan;
  Vec_Ptr_t *pVVar2;
  char *pcVar3;
  char *pName;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  ulong uVar6;
  long lVar7;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> Po_Pool;
  int level;
  Abc_Obj_t *pObjA;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_80;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> local_78;
  Abc_Ntk_t *local_60;
  int local_54;
  Abc_Obj_t *local_50;
  Abc_Obj_t *local_48;
  Abc_Obj_t_ *local_40;
  Abc_Ntk_t *local_38;
  
  local_54 = 1;
  local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_start = (Abc_Obj_t_ **)0x0;
  local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Abc_Obj_t_ **)0x0;
  local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Abc_Obj_t_ **)0x0;
  local_60 = pNtk2;
  local_38 = pNtk_Qbf;
  if ((Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    pVVar2 = pNtk1->vPos;
    pAVar5 = local_80;
    if (0 < pVVar2->nSize) {
      lVar7 = 0;
      do {
        pAVar5 = (Abc_Obj_t *)pVVar2->pArray[lVar7];
        local_40 = (Abc_Obj_t_ *)
                   ((ulong)(*(uint *)&pAVar5->field_0x14 >> 10 & 1) ^
                   *(ulong *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40));
        std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::emplace_back<Abc_Obj_t_*>
                  ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&local_78,&local_40);
        lVar7 = lVar7 + 1;
        pVVar2 = pNtk1->vPos;
      } while (lVar7 < pVVar2->nSize);
    }
    pVVar2 = local_60->vPos;
    local_80 = pAVar5;
    if (0 < pVVar2->nSize) {
      lVar7 = 0;
      do {
        local_80 = (Abc_Obj_t *)pVVar2->pArray[lVar7];
        Bmatch_Construct_MUXes(&local_78,&local_80,&local_38,&local_54,&fConst0);
        local_54 = 1;
        lVar7 = lVar7 + 1;
        pVVar2 = local_60->vPos;
      } while (lVar7 < pVVar2->nSize);
    }
    if (local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    pVVar2 = local_60->vPos;
    pAVar5 = local_80;
    if (0 < pVVar2->nSize) {
      lVar7 = 0;
      do {
        pAVar5 = (Abc_Obj_t *)pVVar2->pArray[lVar7];
        local_48 = Abc_AigXor((Abc_Aig_t *)pNtk_Qbf->pManFunc,(pAVar5->field_6).pCopy,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)&pAVar5->field_0x14 >> 10 & 1) ^
                              *(ulong *)((long)pAVar5->pNtk->vObjs->pArray
                                               [*(pAVar5->vFanins).pArray] + 0x40)));
        if (local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::_M_realloc_insert<Abc_Obj_t_*const&>
                    ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_48);
        }
        else {
          *local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_48;
          local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar7 = lVar7 + 1;
        pVVar2 = local_60->vPos;
      } while (lVar7 < pVVar2->nSize);
    }
    local_80 = pAVar5;
    if (local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        local_50 = Abc_NtkCreateObj(pNtk_Qbf,ABC_OBJ_PI);
        if ((long)local_60->vPos->nSize <= (long)uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pcVar3 = Abc_ObjName((Abc_Obj_t *)local_60->vPos->pArray[uVar6]);
        pName = (char *)operator_new__(0x1e);
        lVar7 = 2;
        do {
          cVar1 = pcVar3[lVar7 + -2];
          pName[lVar7] = cVar1;
          lVar7 = lVar7 + 1;
        } while (cVar1 != '\0');
        pName[0] = 'y';
        pName[1] = '_';
        Abc_ObjAssignName(local_50,pName,"_*");
        operator_delete(pName,1);
        pAVar5 = local_50;
        pMan = (Abc_Aig_t *)pNtk_Qbf->pManFunc;
        pAVar4 = Abc_AigConst1(pNtk_Qbf);
        local_48 = Abc_AigMux(pMan,pAVar5,(Abc_Obj_t *)((ulong)pAVar4 ^ 1),
                              local_78.
                              super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar6]);
        if (Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::_M_realloc_insert<Abc_Obj_t_*const&>
                    ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&Output_Pool,
                     (iterator)
                     Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_48);
        }
        else {
          *Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_48;
          Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::_M_realloc_insert<Abc_Obj_t_*const&>
                    ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&Control_Pool,
                     (iterator)
                     Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          *Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_50;
          Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)local_78.
                                     super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_78.
                                     super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_start != (Abc_Obj_t_ **)0x0) {
      operator_delete(local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("Output_Pool.size() == 0 && Control_Pool.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchQbf.cpp"
                ,0xd2,"void Bmatch_CreatePOMUXes(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Bmatch_CreatePOMUXes( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Abc_Ntk_t * pNtk_Qbf )
{
    Abc_Obj_t * pPo, * pObj, * pObjA;
    int i, level = 1;
    char * pSuffix = new char[3]; pSuffix = "_*\0"; 
    vector< Abc_Obj_t * > Po_Pool;
    char * pName;

    assert( Output_Pool.size() == 0 && Control_Pool.size() == 0 );

    Abc_NtkForEachPo( pNtk1, pPo, i)
    {
        Po_Pool.push_back( Abc_ObjChild0Copy(pPo) );  
    }

    // Construct PO MUXes for Ntk2
    Abc_NtkForEachPo( pNtk2, pPo, i)
    {
        Bmatch_Construct_MUXes( Po_Pool, pPo, pNtk_Qbf, level );
        level = 1;
    }
    Po_Pool.clear();
    
    Abc_NtkForEachPo( pNtk2, pPo, i)
    {
        pObj = Abc_AigXor( (Abc_Aig_t *)pNtk_Qbf->pManFunc, pPo->pCopy, Abc_ObjChild0Copy(pPo) );
        Po_Pool.push_back( pObj );
    }

    for( int j = 0; j < Po_Pool.size(); ++j){
        pObjA = Abc_NtkCreatePi( pNtk_Qbf );

        pName = "y_";
        pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(Abc_NtkPo(pNtk2, j)));
        Abc_ObjAssignName( pObjA, pName, pSuffix );
        delete pName;

        pObj = Abc_AigMux( (Abc_Aig_t *)pNtk_Qbf->pManFunc, pObjA, Abc_ObjNot(Abc_AigConst1(pNtk_Qbf)), Po_Pool[j] );
        Output_Pool.push_back( pObj );
        Control_Pool.push_back( pObjA );
    }
}